

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGui::ShowMetricsWindow::Funcs::NodeDrawList(Funcs *this,ImDrawList *draw_list,char *label)

{
  long lVar1;
  undefined8 uVar2;
  ImGuiWindow *pIVar3;
  long lVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [12];
  ImGuiContext *pIVar7;
  ImDrawList *this_00;
  bool bVar8;
  char cVar9;
  int iVar10;
  float fVar11;
  ImGuiWindow *window;
  uint *puVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  long lVar20;
  undefined8 in_XMM1_Qa;
  float fVar22;
  float fVar23;
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  ImGuiListClipper clipper;
  ImVec2 triangles_pos [3];
  char buf [300];
  undefined4 uVar27;
  int local_1dc;
  undefined1 local_1d8 [12];
  float fStack_1cc;
  float fStack_1c8;
  float local_1c4;
  uint *local_1c0;
  ImDrawList *local_1b8;
  ulong local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  undefined1 local_168 [8];
  ImVec2 aIStack_160 [38];
  
  pcVar14 = "";
  if (*(char **)(this + 0x30) != (char *)0x0) {
    pcVar14 = *(char **)(this + 0x30);
  }
  uVar27 = *(undefined4 *)this;
  bVar8 = TreeNode(this,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar14,
                   (ulong)*(uint *)(this + 0x20),(ulong)*(uint *)(this + 0x10),uVar27);
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  if (pIVar3->DrawList == (ImDrawList *)this) {
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar7->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
      (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    local_168._0_4_ = 1.0;
    local_168._4_4_ = 0.3921569;
    aIStack_160[0].x = 0.3921569;
    aIStack_160[0].y = 1.0;
    TextColored((ImVec4 *)local_168,"CURRENTLY APPENDING");
    if (bVar8) {
      TreePop();
      return;
    }
  }
  else if (bVar8) {
    local_1b8 = &pIVar7->OverlayDrawList;
    auVar6._4_8_ = in_XMM1_Qa;
    auVar6._0_4_ = GNullClipRect.y;
    auVar21._0_8_ = auVar6._0_8_ << 0x20;
    auVar21._8_4_ = GNullClipRect.z;
    auVar21._12_4_ = GNullClipRect.w;
    ImDrawList::PushClipRect(local_1b8,GNullClipRect._0_8_,auVar21._8_8_,false);
    if (0 < *(int *)this) {
      puVar12 = *(uint **)(this + 8);
      local_1dc = 0;
      puVar18 = puVar12;
      do {
        if (*(long *)(puVar18 + 8) == 0) {
          if (*(int *)(this + 0x10) < 1) {
            pcVar14 = "non-indexed";
            lVar20 = 0;
          }
          else {
            lVar20 = *(long *)(this + 0x18);
            pcVar14 = "indexed";
          }
          local_1c0 = puVar18;
          cVar9 = TreeNode((void *)(((long)puVar18 - (long)puVar12 >> 4) * -0x5555555555555555),
                           "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)",
                           (double)(float)puVar18[1],(double)(float)puVar18[2],
                           SUB84((double)(float)puVar18[3],0),(double)(float)puVar18[4],
                           (ulong)*puVar18,pcVar14,*(undefined8 *)(puVar18 + 6),puVar18,uVar27);
          this_00 = local_1b8;
          if ((show_clip_rects == true) &&
             ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true)) {
            local_1b0 = CONCAT71(local_1b0._1_7_,cVar9);
            if (0 < (int)*local_1c0) {
              lVar15 = (long)local_1dc;
              fVar11 = 3.4028235e+38;
              fVar22 = 3.4028235e+38;
              fVar23 = -3.4028235e+38;
              fVar24 = -3.4028235e+38;
              do {
                if (lVar20 == 0) {
                  uVar17 = (uint)lVar15;
                }
                else {
                  uVar17 = (uint)*(ushort *)(lVar20 + lVar15 * 2);
                }
                if (*(int *)(this + 0x20) <= (int)uVar17) {
LAB_0014c15b:
                  __assert_fail("i < Size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                                ,0x353,
                                "value_type &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]"
                               );
                }
                uVar2 = *(undefined8 *)(*(long *)(this + 0x28) + (long)(int)uVar17 * 0x14);
                fVar25 = (float)uVar2;
                fVar26 = (float)((ulong)uVar2 >> 0x20);
                fVar11 = (float)(~-(uint)(fVar25 < fVar11) & (uint)fVar11 |
                                (uint)fVar25 & -(uint)(fVar25 < fVar11));
                fVar22 = (float)(~-(uint)(fVar26 < fVar22) & (uint)fVar22 |
                                (uint)fVar26 & -(uint)(fVar26 < fVar22));
                fVar23 = (float)(~-(uint)(fVar23 < fVar25) & (uint)fVar23 |
                                (uint)fVar25 & -(uint)(fVar23 < fVar25));
                fVar24 = (float)(~-(uint)(fVar24 < fVar26) & (uint)fVar24 |
                                (uint)fVar26 & -(uint)(fVar24 < fVar26));
                lVar15 = lVar15 + 1;
              } while (lVar15 < (int)(*local_1c0 + local_1dc));
              local_1a8 = (float)(int)fVar11;
              fStack_1a4 = (float)(int)fVar22;
              fStack_1a0 = (float)(int)fVar23;
              fStack_19c = (float)(int)fVar24;
            }
            local_168._4_4_ = (float)(int)(float)local_1c0[2];
            local_168._0_4_ = (float)(int)(float)local_1c0[1];
            aIStack_160[0].y = (float)(int)(float)local_1c0[4];
            aIStack_160[0].x = (float)(int)(float)local_1c0[3];
            ImDrawList::AddRect(local_1b8,(ImVec2 *)local_168,aIStack_160,0xff00ffff,0.0,0xf,1.0);
            local_1d8._4_4_ = fStack_1a4;
            local_1d8._0_4_ = local_1a8;
            local_1d8._8_4_ = fStack_1a0;
            fStack_1cc = fStack_19c;
            ImDrawList::AddRect(this_00,(ImVec2 *)local_1d8,(ImVec2 *)(local_1d8 + 8),0xffff00ff,0.0
                                ,0xf,1.0);
            cVar9 = (char)local_1b0;
          }
          puVar18 = local_1c0;
          if (cVar9 != '\0') {
            pIVar3 = GImGui->CurrentWindow;
            local_1d8._4_4_ = -1.0;
            local_1d8._0_4_ = ((pIVar3->DC).CursorPos.y - (pIVar3->Pos).y) + (pIVar3->Scroll).y;
            local_1d8._8_4_ = *local_1c0 / 3;
            fStack_1cc = 0.0;
            fStack_1c8 = -NAN;
            local_1c4 = -NAN;
            while (bVar8 = ImGuiListClipper::Step((ImGuiListClipper *)local_1d8), bVar8) {
              local_1a8 = local_1c4;
              if ((int)fStack_1c8 < (int)local_1c4) {
                uVar19 = (ulong)(uint)((int)fStack_1c8 * 3 + local_1dc);
                fVar11 = fStack_1c8;
                do {
                  pcVar14 = local_168;
                  local_1b0 = (ulong)(uint)fVar11;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar15 = 0;
                  do {
                    lVar1 = lVar15 + (uVar19 & 0xffffffff);
                    if (lVar20 == 0) {
                      uVar17 = (uint)lVar1;
                    }
                    else {
                      uVar17 = (uint)*(ushort *)(lVar20 + (long)(int)uVar19 * 2 + lVar15 * 2);
                    }
                    if (*(int *)(this + 0x20) <= (int)uVar17) goto LAB_0014c15b;
                    lVar4 = *(long *)(this + 0x28);
                    lVar13 = (long)(int)uVar17;
                    IVar5 = *(ImVec2 *)(lVar4 + lVar13 * 0x14);
                    local_188[lVar15] = IVar5;
                    pcVar16 = "   ";
                    if (lVar15 == 0) {
                      pcVar16 = "vtx";
                    }
                    iVar10 = sprintf(pcVar14,
                                     "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n"
                                     ,(double)IVar5.x,(double)IVar5.y,
                                     SUB84((double)*(float *)(lVar4 + 8 + lVar13 * 0x14),0),
                                     (double)*(float *)(lVar4 + 0xc + lVar13 * 0x14),pcVar16,lVar1,
                                     (ulong)*(uint *)(lVar4 + 0x10 + lVar13 * 0x14));
                    pcVar14 = pcVar14 + iVar10;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable(local_168,false,0,&local_190);
                  if ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true) {
                    ImDrawList::AddPolyline(local_1b8,local_188,3,0xff00ffff,true,1.0,false);
                  }
                  uVar19 = (uVar19 & 0xffffffff) + 3;
                  fVar11 = (float)((int)local_1b0 + 1);
                } while (fVar11 != local_1a8);
              }
            }
            TreePop();
            puVar18 = local_1c0;
            if ((float)local_1d8._8_4_ != -NAN) {
              __assert_fail("ItemsCount == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                            ,0x439,"ImGuiListClipper::~ImGuiListClipper()");
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",*(long *)(puVar18 + 8),
                     *(undefined8 *)(puVar18 + 10));
        }
        local_1dc = local_1dc + *puVar18;
        puVar18 = puVar18 + 0xc;
        puVar12 = *(uint **)(this + 8);
      } while (puVar18 < puVar12 + (long)*(int *)this * 0xc);
    }
    ImDrawList::PopClipRect(local_1b8);
    TreePop();
  }
  return;
}

Assistant:

static void NodeDrawList(ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }
                if (!node_open)
                    return;

                ImDrawList* overlay_draw_list = &GImGui->OverlayDrawList;   // Render additional visuals into the top-most draw list
                overlay_draw_list->PushClipRectFullScreen();
                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300], *buf_p = buf;
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += sprintf(buf_p, "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f, false);  // Add triangle without AA, more readable for large-thin triangle
                        }
                    ImGui::TreePop();
                }
                overlay_draw_list->PopClipRect();
                ImGui::TreePop();
            }